

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfobjs.c
# Opt level: O1

FT_Error sfnt_load_face(FT_Stream stream,TT_Face face,FT_Int face_instance_index,FT_Int num_params,
                       FT_Parameter *params)

{
  FT_String **name;
  FT_String **name_00;
  FT_Long *pFVar1;
  byte bVar2;
  ushort uVar3;
  FT_UShort FVar4;
  undefined2 uVar5;
  undefined2 uVar6;
  undefined2 uVar7;
  uint uVar8;
  long lVar9;
  FT_Incremental_InterfaceRec *pFVar10;
  FT_CharMap *ppFVar11;
  FT_CharMap pFVar12;
  FT_Memory memory;
  uint uVar13;
  bool bVar14;
  short sVar15;
  FT_Error FVar16;
  int iVar17;
  TT_Table entry;
  TT_Table pTVar18;
  ulong uVar19;
  FT_Bitmap_Size *pFVar20;
  FT_UShort *pFVar21;
  long lVar22;
  TT_Table pTVar23;
  ulong uVar24;
  TT_Face pTVar25;
  int iVar26;
  ulong uVar27;
  TT_Table pTVar28;
  FT_Encoding FVar29;
  void *pvVar30;
  ulong uVar31;
  bool bVar32;
  FT_CharMapRec cmaprec;
  FT_Error local_98;
  uint local_94;
  TT_Face local_90;
  FT_Bitmap_Size *local_88;
  void *local_80;
  ulong local_78;
  FT_Memory local_70;
  FT_CharMapRec_ local_68 [2];
  uint local_40;
  
  if (num_params < 1) {
    bVar32 = false;
    bVar14 = false;
  }
  else {
    lVar22 = 0;
    bVar14 = false;
    bVar32 = false;
    do {
      lVar9 = *(long *)((long)&params->tag + lVar22);
      if (lVar9 == 0x69677066) {
        bVar14 = true;
      }
      else if (lVar9 == 0x69677073) {
        bVar32 = true;
      }
      lVar22 = lVar22 + 0x10;
    } while ((ulong)(uint)num_params << 4 != lVar22);
  }
  local_94 = CONCAT31(local_94._1_3_,1);
  iVar17 = 1;
  if (((face->root).internal)->incremental_interface == (FT_Incremental_InterfaceRec *)0x0) {
    uVar3 = face->num_tables;
    if (uVar3 != 0) {
      pTVar18 = face->dir_tables;
      pTVar23 = pTVar18 + uVar3;
      pTVar28 = pTVar18;
      do {
        if ((pTVar28->Tag == 0x676c7966) && (pTVar28->Length != 0)) goto LAB_0015f376;
        pTVar28 = pTVar28 + 1;
      } while (pTVar28 < pTVar23);
      pTVar28 = pTVar18;
      if (uVar3 != 0) {
        do {
          if ((pTVar28->Tag == 0x43464620) && (pTVar28->Length != 0)) goto LAB_0015f376;
          pTVar28 = pTVar28 + 1;
        } while (pTVar28 < pTVar23);
        if (uVar3 != 0) {
          iVar17 = 0;
          do {
            if ((pTVar18->Tag == 0x43464632) && (pTVar18->Length != 0)) goto LAB_0015f376;
            pTVar18 = pTVar18 + 1;
          } while (pTVar18 < pTVar23);
          goto LAB_0015f378;
        }
      }
    }
    iVar17 = 0;
  }
LAB_0015f378:
  pvVar30 = face->sfnt;
  local_90 = face;
  FVar16 = (*face->goto_table)(face,0x73626978,stream,(FT_ULong *)0x0);
  pTVar25 = local_90;
  if (FVar16 == 0) {
    iVar17 = 0;
  }
  local_88 = (FT_Bitmap_Size *)CONCAT44(local_88._4_4_,iVar17);
  local_80 = pvVar30;
  if ((iVar17 == 0) && (*(code **)((long)pvVar30 + 0x88) != (code *)0x0)) {
    local_98 = (**(code **)((long)pvVar30 + 0x88))(local_90,stream);
    local_94 = CONCAT31(local_94._1_3_,local_98 != 0);
  }
  if (((FVar16 == 0) || ((char)local_94 != '\0')) &&
     (local_98 = (**(code **)((long)local_80 + 0x30))(pTVar25,stream), local_98 != 0)) {
    return local_98;
  }
  pvVar30 = local_80;
  if ((ushort)((pTVar25->header).Units_Per_EM + 0xbfff) < 0xc00f) {
    return 8;
  }
  local_98 = (**(code **)((long)local_80 + 0x48))(pTVar25,stream);
  local_98 = (**(code **)((long)pvVar30 + 0x40))(pTVar25,stream);
  local_98 = (**(code **)((long)pvVar30 + 0x60))(pTVar25,stream);
  iVar17 = (**(code **)((long)pvVar30 + 0x58))(pTVar25,stream);
  local_98 = iVar17;
  if ((char)local_94 != '\0') {
    local_98 = (**(code **)((long)pvVar30 + 0x38))(pTVar25,stream,0);
    if (local_98 == 0) {
      local_98 = (**(code **)((long)pvVar30 + 0xb8))(pTVar25,stream,0);
      if ((char)local_98 == -0x72) {
        local_98 = 0x93;
LAB_0015f4c3:
        pFVar10 = ((pTVar25->root).internal)->incremental_interface;
        if ((pFVar10 != (FT_Incremental_InterfaceRec *)0x0) &&
           (pFVar10->funcs->get_glyph_metrics != (FT_Incremental_GetGlyphMetricsFunc)0x0)) {
          (pTVar25->horizontal).number_Of_HMetrics = 0;
          local_98 = 0;
        }
      }
    }
    else if ((char)local_98 == -0x72) {
      if (pTVar25->format_tag != 0x74727565) {
        local_98 = 0x8f;
        goto LAB_0015f4c3;
      }
      local_98 = 0;
      local_88 = (FT_Bitmap_Size *)((ulong)local_88 & 0xffffffff00000000);
    }
    pvVar30 = local_80;
    if (local_98 != 0) {
      return local_98;
    }
    local_98 = (**(code **)((long)local_80 + 0x38))(pTVar25,stream,1);
    if ((local_98 == 0) &&
       (local_98 = (**(code **)((long)pvVar30 + 0xb8))(pTVar25,stream,1), local_98 == 0)) {
      pTVar25->vertical_info = '\x01';
    }
    pvVar30 = local_80;
    if (local_98 != 0 && (char)local_98 != -0x72) {
      return local_98;
    }
    local_98 = (**(code **)((long)local_80 + 0x50))(pTVar25,stream);
    if (local_98 != 0) {
      (pTVar25->os2).version = 0xffff;
    }
  }
  if (*(code **)((long)pvVar30 + 0xc0) != (code *)0x0) {
    local_98 = (**(code **)((long)pvVar30 + 0xc0))(pTVar25,stream);
  }
  local_98 = (**(code **)((long)pvVar30 + 0x80))(pTVar25,stream);
  local_98 = (**(code **)((long)pvVar30 + 0x78))(pTVar25,stream);
  local_98 = (**(code **)((long)pvVar30 + 0x70))(pTVar25);
  (pTVar25->root).num_glyphs = (ulong)(pTVar25->max_profile).numGlyphs;
  name = &(pTVar25->root).family_name;
  name_00 = &(pTVar25->root).style_name;
  (pTVar25->root).family_name = (FT_String *)0x0;
  (pTVar25->root).style_name = (FT_String *)0x0;
  if (((pTVar25->os2).version == 0xffff) || (((pTVar25->os2).fsSelection & 0x100) == 0)) {
    local_98 = tt_face_get_name(pTVar25,0x15,name);
    if (local_98 != 0) {
      return local_98;
    }
    FVar16 = 0;
    if ((!bVar14 && *name == (FT_String *)0x0) &&
       (FVar16 = tt_face_get_name(pTVar25,0x10,name), FVar16 != 0)) {
      return FVar16;
    }
    local_98 = FVar16;
    if (*name == (FT_String *)0x0) {
      FVar16 = tt_face_get_name(pTVar25,1,name);
      if (FVar16 != 0) {
        return FVar16;
      }
      local_98 = 0;
    }
    FVar16 = tt_face_get_name(pTVar25,0x16,name_00);
    if (FVar16 != 0) {
      return FVar16;
    }
    local_98 = 0;
    iVar26 = 0;
    if (!bVar32 && *name_00 == (FT_String *)0x0) goto LAB_0015f679;
  }
  else {
    if ((!bVar14) && (local_98 = tt_face_get_name(pTVar25,0x10,name), local_98 != 0)) {
      return local_98;
    }
    if ((*name == (FT_String *)0x0) && (local_98 = tt_face_get_name(pTVar25,1,name), local_98 != 0))
    {
      return local_98;
    }
    iVar26 = local_98;
    if (!bVar32) {
LAB_0015f679:
      local_98 = iVar26;
      local_98 = tt_face_get_name(pTVar25,0x11,name_00);
      if (local_98 != 0) {
        return local_98;
      }
    }
  }
  if ((*name_00 == (FT_String *)0x0) &&
     (local_98 = tt_face_get_name(pTVar25,2,name_00), local_98 != 0)) {
    return local_98;
  }
  uVar19 = (pTVar25->root).face_flags;
  uVar24 = uVar19 | 0x4000;
  if ((pTVar25->sbit_table_type & ~TT_SBIT_TABLE_TYPE_EBLC) != TT_SBIT_TABLE_TYPE_CBLC) {
    uVar24 = uVar19;
  }
  uVar24 = (char)local_88 == '\x01' | uVar24;
  uVar19 = uVar24 | 0x18;
  if ((iVar17 == 0) && ((pTVar25->postscript).FormatType != 0x30000)) {
    uVar19 = uVar24 | 0x218;
  }
  uVar24 = uVar19 | 4;
  if ((pTVar25->postscript).isFixedPitch == 0) {
    uVar24 = uVar19;
  }
  uVar19 = uVar24 | 0x20;
  if (pTVar25->vertical_info == '\0') {
    uVar19 = uVar24;
  }
  uVar24 = uVar19 | 0x40;
  if (pTVar25->kern_avail_bits == 0) {
    uVar24 = uVar19;
  }
  if ((pTVar25->variation_support & 1) != 0) {
    pTVar18 = pTVar25->dir_tables;
    uVar3 = pTVar25->num_tables;
    pTVar23 = pTVar18 + uVar3;
    pTVar28 = pTVar18;
    if (uVar3 != 0) {
      do {
        if ((pTVar28->Tag == 0x676c7966) && (pTVar28->Length != 0)) {
          bVar32 = true;
          pTVar28 = pTVar18;
          if (uVar3 != 0) goto LAB_0015f801;
          goto LAB_0015f81e;
        }
        pTVar28 = pTVar28 + 1;
      } while (pTVar28 < pTVar23);
    }
LAB_0015f82f:
    bVar32 = true;
    if (uVar3 != 0) {
      do {
        if ((pTVar18->Tag == 0x43464632) && (pTVar18->Length != 0)) {
          bVar32 = false;
          break;
        }
        pTVar18 = pTVar18 + 1;
      } while (pTVar18 < pTVar23);
    }
    if (!bVar32) {
      uVar24 = uVar24 | 0x100;
    }
  }
  (pTVar25->root).face_flags = uVar24;
  if (((char)local_88 == '\x01') && ((pTVar25->os2).version != 0xffff)) {
    uVar3 = (pTVar25->os2).fsSelection;
    uVar19 = (ulong)((uint)((uVar3 & 0x201) != 0) | uVar3 >> 4 & 2);
  }
  else {
    bVar2 = (byte)(pTVar25->header).Mac_Style;
    uVar19 = (ulong)(byte)((bVar2 & 2) >> 1 | bVar2 * '\x02') & 3;
  }
  pFVar1 = &(pTVar25->root).style_flags;
  *pFVar1 = *pFVar1 | uVar19;
  tt_face_build_cmaps(pTVar25);
  iVar17 = (pTVar25->root).num_charmaps;
  if ((long)iVar17 < 1) {
LAB_0015f93c:
    local_68[0].encoding = FT_ENCODING_UNICODE;
    local_68[0].platform_id = 3;
    local_68[0].encoding_id = 1;
    local_68[0].face = &pTVar25->root;
    FVar16 = FT_CMap_New(&tt_cmap_unicode_class_rec.clazz,(FT_Pointer)0x0,local_68,
                         (FT_CMap_conflict *)0x0);
    bVar32 = (char)FVar16 == -0x5d;
    iVar17 = FVar16;
    if (bVar32) {
      iVar17 = 0;
    }
    iVar26 = 0x1b;
    local_98 = iVar17;
    if (bVar32 || FVar16 == 0) goto LAB_0015f985;
  }
  else {
    ppFVar11 = (pTVar25->root).charmaps;
    lVar22 = 0;
    bVar32 = false;
    do {
      pFVar12 = ppFVar11[lVar22];
      uVar19 = 0xfffffffffffffff4;
      do {
        if ((*(uint *)((long)&DAT_0019fe8c + uVar19) == (uint)pFVar12->platform_id) &&
           ((*(uint *)((long)&DAT_0019fe90 + uVar19) == (uint)pFVar12->encoding_id ||
            (*(uint *)((long)&DAT_0019fe90 + uVar19) == 0xffffffff)))) {
          FVar29 = *(FT_Encoding *)((long)&DAT_0019fe94 + uVar19);
          goto LAB_0015f911;
        }
        uVar19 = uVar19 + 0xc;
      } while (uVar19 < 0x78);
      FVar29 = FT_ENCODING_NONE;
LAB_0015f911:
      pFVar12->encoding = FVar29;
      if ((FVar29 == FT_ENCODING_UNICODE) || (FVar29 == FT_ENCODING_MS_SYMBOL)) {
        bVar32 = true;
      }
      lVar22 = lVar22 + 1;
    } while (lVar22 != iVar17);
    pTVar25 = local_90;
    if (!bVar32) goto LAB_0015f93c;
LAB_0015f985:
    iVar26 = 0;
  }
  pTVar25 = local_90;
  if (iVar26 != 0) goto LAB_0015fc88;
  uVar8 = local_90->sbit_num_strikes;
  uVar19 = (ulong)uVar8;
  if (uVar19 == 0) {
LAB_0015fb4d:
    iVar26 = 0;
  }
  else {
    memory = ((local_90->root).stream)->memory;
    FVar4 = (local_90->header).Units_Per_EM;
    if ((FVar4 == 0) || ((local_90->os2).version == 0xffff)) {
      local_94 = CONCAT22(local_94._2_2_,1);
      local_90 = (TT_Face)CONCAT62(local_90._2_6_,1);
    }
    else {
      local_94 = CONCAT22(local_94._2_2_,FVar4);
      local_90 = (TT_Face)CONCAT62(local_90._2_6_,(local_90->os2).xAvgCharWidth);
    }
    bVar32 = false;
    pFVar20 = (FT_Bitmap_Size *)ft_mem_realloc(memory,0x20,0,uVar19,(void *)0x0,&local_98);
    (pTVar25->root).available_sizes = pFVar20;
    iVar26 = 0x1b;
    if (local_98 == 0) {
      pFVar20 = (FT_Bitmap_Size *)ft_mem_realloc(memory,4,0,uVar19,(void *)0x0,&local_98);
      bVar32 = false;
      if (local_98 == 0) {
        local_90 = (TT_Face)CONCAT44(local_90._4_4_,(int)(short)local_90);
        uVar13 = local_94 >> 1;
        uVar24 = 1;
        if (1 < uVar8) {
          uVar24 = (ulong)uVar8;
        }
        uVar27 = 0;
        uVar31 = 0;
        local_94 = local_94 & 0xffff;
        local_88 = pFVar20;
        local_78 = uVar19;
        local_70 = memory;
        do {
          pFVar20 = (pTVar25->root).available_sizes;
          local_98 = (**(code **)((long)local_80 + 0xd8))(pTVar25,uVar27,local_68);
          uVar19 = uVar31;
          if (local_98 == 0) {
            pFVar20[uVar31].height = (FT_Short)(local_40 >> 6);
            pFVar20[uVar31].width =
                 (FT_Short)
                 ((int)((uint)(ushort)local_68[0].face * (int)local_90 + (uVar13 & 0x7fff)) /
                 (int)local_94);
            pFVar20[uVar31].x_ppem = ((ulong)local_68[0].face & 0xffff) << 6;
            pFVar20[uVar31].y_ppem = (ulong)local_68[0].face._2_2_ << 6;
            pFVar20[uVar31].size = (ulong)local_68[0].face._2_2_ << 6;
            if (local_68[0].face._2_2_ != 0 && (ushort)local_68[0].face != 0) {
              uVar19 = (ulong)((int)uVar31 + 1);
              *(int *)(&local_88->height + uVar31 * 2) = (int)uVar27;
            }
          }
          uVar27 = uVar27 + 1;
          uVar31 = uVar19;
        } while (uVar24 != uVar27);
        pFVar20 = (FT_Bitmap_Size *)ft_mem_realloc(local_70,4,local_78,uVar19,local_88,&local_98);
        iVar26 = 0;
        bVar32 = true;
        if ((int)uVar19 != 0) {
          pTVar25->sbit_strike_map = (FT_UInt *)pFVar20;
          pFVar1 = &(pTVar25->root).face_flags;
          *(byte *)pFVar1 = (byte)*pFVar1 | 2;
          (pTVar25->root).num_fixed_sizes = (int)uVar19;
        }
      }
    }
    iVar17 = (int)pFVar20;
    if (bVar32) goto LAB_0015fb4d;
  }
  if (iVar26 == 0) {
    uVar19 = (pTVar25->root).face_flags;
    if ((uVar19 & 3) == 0) {
      uVar19 = uVar19 | 1;
      (pTVar25->root).face_flags = uVar19;
    }
    iVar17 = (int)uVar19;
    iVar26 = 0;
    if (((pTVar25->root).face_flags & 1) != 0) {
      (pTVar25->root).bbox.xMin = (long)(pTVar25->header).xMin;
      (pTVar25->root).bbox.yMin = (long)(pTVar25->header).yMin;
      (pTVar25->root).bbox.xMax = (long)(pTVar25->header).xMax;
      (pTVar25->root).bbox.yMax = (long)(pTVar25->header).yMax;
      (pTVar25->root).units_per_EM = (pTVar25->header).Units_Per_EM;
      uVar5 = (pTVar25->horizontal).Ascender;
      (pTVar25->root).ascender = uVar5;
      sVar15 = (pTVar25->horizontal).Descender;
      (pTVar25->root).descender = sVar15;
      (pTVar25->root).height = (uVar5 - sVar15) + (pTVar25->horizontal).Line_Gap;
      if ((sVar15 == 0 && uVar5 == 0) && ((pTVar25->os2).version != 0xffff)) {
        sVar15 = (pTVar25->os2).sTypoAscender;
        if ((sVar15 == 0) && ((pTVar25->os2).sTypoDescender == 0)) {
          uVar7 = (pTVar25->os2).usWinAscent;
          (pTVar25->root).ascender = uVar7;
          FVar4 = (pTVar25->os2).usWinDescent;
          (pTVar25->root).descender = -FVar4;
          sVar15 = FVar4 + uVar7;
        }
        else {
          (pTVar25->root).ascender = sVar15;
          uVar6 = (pTVar25->os2).sTypoDescender;
          (pTVar25->root).descender = uVar6;
          sVar15 = (sVar15 - uVar6) + (pTVar25->os2).sTypoLineGap;
        }
        (pTVar25->root).height = sVar15;
      }
      (pTVar25->root).max_advance_width = (pTVar25->horizontal).advance_Width_Max;
      pFVar21 = &(pTVar25->vertical).advance_Height_Max;
      if (pTVar25->vertical_info == '\0') {
        pFVar21 = (FT_UShort *)&(pTVar25->root).height;
      }
      (pTVar25->root).max_advance_height = *pFVar21;
      sVar15 = (pTVar25->postscript).underlineThickness;
      iVar17 = *(int *)&(pTVar25->postscript).underlinePosition -
               ((int)(short)(sVar15 - (sVar15 >> 0xf)) >> 1);
      (pTVar25->root).underline_position = (FT_Short)iVar17;
      (pTVar25->root).underline_thickness = sVar15;
    }
  }
LAB_0015fc88:
  if ((iVar26 != 0x1b) && (iVar26 != 0)) {
    return iVar17;
  }
  return local_98;
LAB_0015f376:
  iVar17 = 1;
  goto LAB_0015f378;
  while (pTVar28 = pTVar28 + 1, pTVar28 < pTVar23) {
LAB_0015f801:
    if ((pTVar28->Tag == 0x67766172) && (pTVar28->Length != 0)) {
      bVar32 = false;
      break;
    }
  }
LAB_0015f81e:
  if (!bVar32) {
    uVar24 = uVar24 | 0x100;
  }
  goto LAB_0015f82f;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  sfnt_load_face( FT_Stream      stream,
                  TT_Face        face,
                  FT_Int         face_instance_index,
                  FT_Int         num_params,
                  FT_Parameter*  params )
  {
    FT_Error      error;
#ifdef TT_CONFIG_OPTION_POSTSCRIPT_NAMES
    FT_Error      psnames_error;
#endif
    FT_Bool       has_outline;
    FT_Bool       is_apple_sbit;
    FT_Bool       is_apple_sbix;
    FT_Bool       ignore_typographic_family    = FALSE;
    FT_Bool       ignore_typographic_subfamily = FALSE;

    SFNT_Service  sfnt = (SFNT_Service)face->sfnt;

    FT_UNUSED( face_instance_index );


    /* Check parameters */

    {
      FT_Int  i;


      for ( i = 0; i < num_params; i++ )
      {
        if ( params[i].tag == FT_PARAM_TAG_IGNORE_TYPOGRAPHIC_FAMILY )
          ignore_typographic_family = TRUE;
        else if ( params[i].tag == FT_PARAM_TAG_IGNORE_TYPOGRAPHIC_SUBFAMILY )
          ignore_typographic_subfamily = TRUE;
      }
    }

    /* Load tables */

    /* We now support two SFNT-based bitmapped font formats.  They */
    /* are recognized easily as they do not include a `glyf'       */
    /* table.                                                      */
    /*                                                             */
    /* The first format comes from Apple, and uses a table named   */
    /* `bhed' instead of `head' to store the font header (using    */
    /* the same format).  It also doesn't include horizontal and   */
    /* vertical metrics tables (i.e. `hhea' and `vhea' tables are  */
    /* missing).                                                   */
    /*                                                             */
    /* The other format comes from Microsoft, and is used with     */
    /* WinCE/PocketPC.  It looks like a standard TTF, except that  */
    /* it doesn't contain outlines.                                */
    /*                                                             */

    FT_TRACE2(( "sfnt_load_face: %08p\n\n", face ));

    /* do we have outlines in there? */
#ifdef FT_CONFIG_OPTION_INCREMENTAL
    has_outline = FT_BOOL( face->root.internal->incremental_interface ||
                           tt_face_lookup_table( face, TTAG_glyf )    ||
                           tt_face_lookup_table( face, TTAG_CFF )     ||
                           tt_face_lookup_table( face, TTAG_CFF2 )    );
#else
    has_outline = FT_BOOL( tt_face_lookup_table( face, TTAG_glyf ) ||
                           tt_face_lookup_table( face, TTAG_CFF )  ||
                           tt_face_lookup_table( face, TTAG_CFF2 ) );
#endif

    is_apple_sbit = 0;
    is_apple_sbix = !face->goto_table( face, TTAG_sbix, stream, 0 );

    /* Apple 'sbix' color bitmaps are rendered scaled and then the 'glyf'
     * outline rendered on top.  We don't support that yet, so just ignore
     * the 'glyf' outline and advertise it as a bitmap-only font. */
    if ( is_apple_sbix )
      has_outline = FALSE;

    /* if this font doesn't contain outlines, we try to load */
    /* a `bhed' table                                        */
    if ( !has_outline && sfnt->load_bhed )
    {
      LOAD_( bhed );
      is_apple_sbit = FT_BOOL( !error );
    }

    /* load the font header (`head' table) if this isn't an Apple */
    /* sbit font file                                             */
    if ( !is_apple_sbit || is_apple_sbix )
    {
      LOAD_( head );
      if ( error )
        goto Exit;
    }

    /* OpenType 1.8.2 introduced limits to this value;    */
    /* however, they make sense for older SFNT fonts also */
    if ( face->header.Units_Per_EM <    16 ||
         face->header.Units_Per_EM > 16384 )
    {
      error = FT_THROW( Invalid_Table );

      goto Exit;
    }

    /* the following tables are often not present in embedded TrueType */
    /* fonts within PDF documents, so don't check for them.            */
    LOAD_( maxp );
    LOAD_( cmap );

    /* the following tables are optional in PCL fonts -- */
    /* don't check for errors                            */
    LOAD_( name );
    LOAD_( post );

#ifdef TT_CONFIG_OPTION_POSTSCRIPT_NAMES
    psnames_error = error;
#endif

    /* do not load the metrics headers and tables if this is an Apple */
    /* sbit font file                                                 */
    if ( !is_apple_sbit )
    {
      /* load the `hhea' and `hmtx' tables */
      LOADM_( hhea, 0 );
      if ( !error )
      {
        LOADM_( hmtx, 0 );
        if ( FT_ERR_EQ( error, Table_Missing ) )
        {
          error = FT_THROW( Hmtx_Table_Missing );

#ifdef FT_CONFIG_OPTION_INCREMENTAL
          /* If this is an incrementally loaded font and there are */
          /* overriding metrics, tolerate a missing `hmtx' table.  */
          if ( face->root.internal->incremental_interface          &&
               face->root.internal->incremental_interface->funcs->
                 get_glyph_metrics                                 )
          {
            face->horizontal.number_Of_HMetrics = 0;
            error                               = FT_Err_Ok;
          }
#endif
        }
      }
      else if ( FT_ERR_EQ( error, Table_Missing ) )
      {
        /* No `hhea' table necessary for SFNT Mac fonts. */
        if ( face->format_tag == TTAG_true )
        {
          FT_TRACE2(( "This is an SFNT Mac font.\n" ));

          has_outline = 0;
          error       = FT_Err_Ok;
        }
        else
        {
          error = FT_THROW( Horiz_Header_Missing );

#ifdef FT_CONFIG_OPTION_INCREMENTAL
          /* If this is an incrementally loaded font and there are */
          /* overriding metrics, tolerate a missing `hhea' table.  */
          if ( face->root.internal->incremental_interface          &&
               face->root.internal->incremental_interface->funcs->
                 get_glyph_metrics                                 )
          {
            face->horizontal.number_Of_HMetrics = 0;
            error                               = FT_Err_Ok;
          }
#endif

        }
      }

      if ( error )
        goto Exit;

      /* try to load the `vhea' and `vmtx' tables */
      LOADM_( hhea, 1 );
      if ( !error )
      {
        LOADM_( hmtx, 1 );
        if ( !error )
          face->vertical_info = 1;
      }

      if ( error && FT_ERR_NEQ( error, Table_Missing ) )
        goto Exit;

      LOAD_( os2 );
      if ( error )
      {
        /* we treat the table as missing if there are any errors */
        face->os2.version = 0xFFFFU;
      }
    }

    /* the optional tables */

    /* embedded bitmap support */
    if ( sfnt->load_eblc )
      LOAD_( eblc );

    /* consider the pclt, kerning, and gasp tables as optional */
    LOAD_( pclt );
    LOAD_( gasp );
    LOAD_( kern );

    face->root.num_glyphs = face->max_profile.numGlyphs;

    /* Bit 8 of the `fsSelection' field in the `OS/2' table denotes  */
    /* a WWS-only font face.  `WWS' stands for `weight', width', and */
    /* `slope', a term used by Microsoft's Windows Presentation      */
    /* Foundation (WPF).  This flag has been introduced in version   */
    /* 1.5 of the OpenType specification (May 2008).                 */

    face->root.family_name = NULL;
    face->root.style_name  = NULL;
    if ( face->os2.version != 0xFFFFU && face->os2.fsSelection & 256 )
    {
      if ( !ignore_typographic_family )
        GET_NAME( TYPOGRAPHIC_FAMILY, &face->root.family_name );
      if ( !face->root.family_name )
        GET_NAME( FONT_FAMILY, &face->root.family_name );

      if ( !ignore_typographic_subfamily )
        GET_NAME( TYPOGRAPHIC_SUBFAMILY, &face->root.style_name );
      if ( !face->root.style_name )
        GET_NAME( FONT_SUBFAMILY, &face->root.style_name );
    }
    else
    {
      GET_NAME( WWS_FAMILY, &face->root.family_name );
      if ( !face->root.family_name && !ignore_typographic_family )
        GET_NAME( TYPOGRAPHIC_FAMILY, &face->root.family_name );
      if ( !face->root.family_name )
        GET_NAME( FONT_FAMILY, &face->root.family_name );

      GET_NAME( WWS_SUBFAMILY, &face->root.style_name );
      if ( !face->root.style_name && !ignore_typographic_subfamily )
        GET_NAME( TYPOGRAPHIC_SUBFAMILY, &face->root.style_name );
      if ( !face->root.style_name )
        GET_NAME( FONT_SUBFAMILY, &face->root.style_name );
    }

    /* now set up root fields */
    {
      FT_Face  root  = &face->root;
      FT_Long  flags = root->face_flags;


      /*********************************************************************/
      /*                                                                   */
      /* Compute face flags.                                               */
      /*                                                                   */
      if ( face->sbit_table_type == TT_SBIT_TABLE_TYPE_CBLC ||
           face->sbit_table_type == TT_SBIT_TABLE_TYPE_SBIX )
        flags |= FT_FACE_FLAG_COLOR;      /* color glyphs */

      if ( has_outline == TRUE )
        flags |= FT_FACE_FLAG_SCALABLE;   /* scalable outlines */

      /* The sfnt driver only supports bitmap fonts natively, thus we */
      /* don't set FT_FACE_FLAG_HINTER.                               */
      flags |= FT_FACE_FLAG_SFNT       |  /* SFNT file format  */
               FT_FACE_FLAG_HORIZONTAL;   /* horizontal data   */

#ifdef TT_CONFIG_OPTION_POSTSCRIPT_NAMES
      if ( !psnames_error                             &&
           face->postscript.FormatType != 0x00030000L )
        flags |= FT_FACE_FLAG_GLYPH_NAMES;
#endif

      /* fixed width font? */
      if ( face->postscript.isFixedPitch )
        flags |= FT_FACE_FLAG_FIXED_WIDTH;

      /* vertical information? */
      if ( face->vertical_info )
        flags |= FT_FACE_FLAG_VERTICAL;

      /* kerning available ? */
      if ( TT_FACE_HAS_KERNING( face ) )
        flags |= FT_FACE_FLAG_KERNING;

#ifdef TT_CONFIG_OPTION_GX_VAR_SUPPORT
      /* Don't bother to load the tables unless somebody asks for them. */
      /* No need to do work which will (probably) not be used.          */
      if ( face->variation_support & TT_FACE_FLAG_VAR_FVAR )
      {
        if ( tt_face_lookup_table( face, TTAG_glyf ) != 0 &&
             tt_face_lookup_table( face, TTAG_gvar ) != 0 )
          flags |= FT_FACE_FLAG_MULTIPLE_MASTERS;
        if ( tt_face_lookup_table( face, TTAG_CFF2 ) != 0 )
          flags |= FT_FACE_FLAG_MULTIPLE_MASTERS;
      }
#endif

      root->face_flags = flags;

      /*********************************************************************/
      /*                                                                   */
      /* Compute style flags.                                              */
      /*                                                                   */

      flags = 0;
      if ( has_outline == TRUE && face->os2.version != 0xFFFFU )
      {
        /* We have an OS/2 table; use the `fsSelection' field.  Bit 9 */
        /* indicates an oblique font face.  This flag has been        */
        /* introduced in version 1.5 of the OpenType specification.   */

        if ( face->os2.fsSelection & 512 )       /* bit 9 */
          flags |= FT_STYLE_FLAG_ITALIC;
        else if ( face->os2.fsSelection & 1 )    /* bit 0 */
          flags |= FT_STYLE_FLAG_ITALIC;

        if ( face->os2.fsSelection & 32 )        /* bit 5 */
          flags |= FT_STYLE_FLAG_BOLD;
      }
      else
      {
        /* this is an old Mac font, use the header field */

        if ( face->header.Mac_Style & 1 )
          flags |= FT_STYLE_FLAG_BOLD;

        if ( face->header.Mac_Style & 2 )
          flags |= FT_STYLE_FLAG_ITALIC;
      }

      root->style_flags |= flags;

      /*********************************************************************/
      /*                                                                   */
      /* Polish the charmaps.                                              */
      /*                                                                   */
      /*   Try to set the charmap encoding according to the platform &     */
      /*   encoding ID of each charmap.  Emulate Unicode charmap if one    */
      /*   is missing.                                                     */
      /*                                                                   */

      tt_face_build_cmaps( face );  /* ignore errors */


      /* set the encoding fields */
      {
        FT_Int   m;
#ifdef FT_CONFIG_OPTION_POSTSCRIPT_NAMES
        FT_Bool  has_unicode = FALSE;
#endif


        for ( m = 0; m < root->num_charmaps; m++ )
        {
          FT_CharMap  charmap = root->charmaps[m];


          charmap->encoding = sfnt_find_encoding( charmap->platform_id,
                                                  charmap->encoding_id );

#ifdef FT_CONFIG_OPTION_POSTSCRIPT_NAMES

          if ( charmap->encoding == FT_ENCODING_UNICODE   ||
               charmap->encoding == FT_ENCODING_MS_SYMBOL )  /* PUA */
            has_unicode = TRUE;
        }

        /* synthesize Unicode charmap if one is missing */
        if ( !has_unicode )
        {
          FT_CharMapRec cmaprec;


          cmaprec.face        = root;
          cmaprec.platform_id = TT_PLATFORM_MICROSOFT;
          cmaprec.encoding_id = TT_MS_ID_UNICODE_CS;
          cmaprec.encoding    = FT_ENCODING_UNICODE;


          error = FT_CMap_New( (FT_CMap_Class)&tt_cmap_unicode_class_rec,
                               NULL, &cmaprec, NULL );
          if ( error                                      &&
               FT_ERR_NEQ( error, No_Unicode_Glyph_Name ) )
            goto Exit;
          error = FT_Err_Ok;

#endif /* FT_CONFIG_OPTION_POSTSCRIPT_NAMES */

        }
      }

#ifdef TT_CONFIG_OPTION_EMBEDDED_BITMAPS

      /*
       *  Now allocate the root array of FT_Bitmap_Size records and
       *  populate them.  Unfortunately, it isn't possible to indicate bit
       *  depths in the FT_Bitmap_Size record.  This is a design error.
       */
      {
        FT_UInt  count;


        count = face->sbit_num_strikes;

        if ( count > 0 )
        {
          FT_Memory        memory   = face->root.stream->memory;
          FT_UShort        em_size  = face->header.Units_Per_EM;
          FT_Short         avgwidth = face->os2.xAvgCharWidth;
          FT_Size_Metrics  metrics;

          FT_UInt*  sbit_strike_map = NULL;
          FT_UInt   strike_idx, bsize_idx;


          if ( em_size == 0 || face->os2.version == 0xFFFFU )
          {
            avgwidth = 1;
            em_size = 1;
          }

          /* to avoid invalid strike data in the `available_sizes' field */
          /* of `FT_Face', we map `available_sizes' indices to strike    */
          /* indices                                                     */
          if ( FT_NEW_ARRAY( root->available_sizes, count ) ||
               FT_NEW_ARRAY( sbit_strike_map, count ) )
            goto Exit;

          bsize_idx = 0;
          for ( strike_idx = 0; strike_idx < count; strike_idx++ )
          {
            FT_Bitmap_Size*  bsize = root->available_sizes + bsize_idx;


            error = sfnt->load_strike_metrics( face, strike_idx, &metrics );
            if ( error )
              continue;

            bsize->height = (FT_Short)( metrics.height >> 6 );
            bsize->width  = (FT_Short)(
              ( avgwidth * metrics.x_ppem + em_size / 2 ) / em_size );

            bsize->x_ppem = metrics.x_ppem << 6;
            bsize->y_ppem = metrics.y_ppem << 6;

            /* assume 72dpi */
            bsize->size   = metrics.y_ppem << 6;

            /* only use strikes with valid PPEM values */
            if ( bsize->x_ppem && bsize->y_ppem )
              sbit_strike_map[bsize_idx++] = strike_idx;
          }

          /* reduce array size to the actually used elements */
          (void)FT_RENEW_ARRAY( sbit_strike_map, count, bsize_idx );

          /* from now on, all strike indices are mapped */
          /* using `sbit_strike_map'                    */
          if ( bsize_idx )
          {
            face->sbit_strike_map = sbit_strike_map;

            root->face_flags     |= FT_FACE_FLAG_FIXED_SIZES;
            root->num_fixed_sizes = (FT_Int)bsize_idx;
          }
        }
      }

#endif /* TT_CONFIG_OPTION_EMBEDDED_BITMAPS */

      /* a font with no bitmaps and no outlines is scalable; */
      /* it has only empty glyphs then                       */
      if ( !FT_HAS_FIXED_SIZES( root ) && !FT_IS_SCALABLE( root ) )
        root->face_flags |= FT_FACE_FLAG_SCALABLE;


      /*********************************************************************/
      /*                                                                   */
      /*  Set up metrics.                                                  */
      /*                                                                   */
      if ( FT_IS_SCALABLE( root ) )
      {
        /* XXX What about if outline header is missing */
        /*     (e.g. sfnt wrapped bitmap)?             */
        root->bbox.xMin    = face->header.xMin;
        root->bbox.yMin    = face->header.yMin;
        root->bbox.xMax    = face->header.xMax;
        root->bbox.yMax    = face->header.yMax;
        root->units_per_EM = face->header.Units_Per_EM;


        /* XXX: Computing the ascender/descender/height is very different */
        /*      from what the specification tells you.  Apparently, we    */
        /*      must be careful because                                   */
        /*                                                                */
        /*      - not all fonts have an OS/2 table; in this case, we take */
        /*        the values in the horizontal header.  However, these    */
        /*        values very often are not reliable.                     */
        /*                                                                */
        /*      - otherwise, the correct typographic values are in the    */
        /*        sTypoAscender, sTypoDescender & sTypoLineGap fields.    */
        /*                                                                */
        /*        However, certain fonts have these fields set to 0.      */
        /*        Rather, they have usWinAscent & usWinDescent correctly  */
        /*        set (but with different values).                        */
        /*                                                                */
        /*      As an example, Arial Narrow is implemented through four   */
        /*      files ARIALN.TTF, ARIALNI.TTF, ARIALNB.TTF & ARIALNBI.TTF */
        /*                                                                */
        /*      Strangely, all fonts have the same values in their        */
        /*      sTypoXXX fields, except ARIALNB which sets them to 0.     */
        /*                                                                */
        /*      On the other hand, they all have different                */
        /*      usWinAscent/Descent values -- as a conclusion, the OS/2   */
        /*      table cannot be used to compute the text height reliably! */
        /*                                                                */

        /* The ascender and descender are taken from the `hhea' table. */
        /* If zero, they are taken from the `OS/2' table.              */

        root->ascender  = face->horizontal.Ascender;
        root->descender = face->horizontal.Descender;

        root->height = root->ascender - root->descender +
                       face->horizontal.Line_Gap;

        if ( !( root->ascender || root->descender ) )
        {
          if ( face->os2.version != 0xFFFFU )
          {
            if ( face->os2.sTypoAscender || face->os2.sTypoDescender )
            {
              root->ascender  = face->os2.sTypoAscender;
              root->descender = face->os2.sTypoDescender;

              root->height = root->ascender - root->descender +
                             face->os2.sTypoLineGap;
            }
            else
            {
              root->ascender  =  (FT_Short)face->os2.usWinAscent;
              root->descender = -(FT_Short)face->os2.usWinDescent;

              root->height = root->ascender - root->descender;
            }
          }
        }

        root->max_advance_width  =
          (FT_Short)face->horizontal.advance_Width_Max;
        root->max_advance_height =
          (FT_Short)( face->vertical_info ? face->vertical.advance_Height_Max
                                          : root->height );

        /* See https://www.microsoft.com/typography/otspec/post.htm -- */
        /* Adjust underline position from top edge to centre of        */
        /* stroke to convert TrueType meaning to FreeType meaning.     */
        root->underline_position  = face->postscript.underlinePosition -
                                    face->postscript.underlineThickness / 2;
        root->underline_thickness = face->postscript.underlineThickness;
      }

    }

  Exit:
    FT_TRACE2(( "sfnt_load_face: done\n" ));

    return error;
  }